

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcscan.c
# Opt level: O3

int gcscan1(int probe)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  
  if (0 < probe) {
    uVar3 = (ulong)(uint)probe;
    do {
      uVar1 = HTmain[uVar3 - 1];
      if ((uVar1 != 0) && ((uVar1 < 0x10000 || ((uVar1 & 1) != 0)))) {
        return (int)uVar3 + -1;
      }
      bVar2 = 1 < uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
  }
  return -1;
}

Assistant:

int gcscan1(int probe)
/* probe is offset */
{
  struct htlinkptr *htlptr; /* overlay access method */
  int contents;
  while (--probe >= 0) /* End of HTmain Table ? */
  {
    /* Start addr. of scanning */
    htlptr = (struct htlinkptr *)(HTmain + probe);
    contents = ((struct htlinkptr *)GCPTR(htlptr))->contents;
    if (contents && (((struct hashentry *)GCPTR(HTENDS))->collision || (GetStkCnt(contents) == 0)))
      return (probe);
  }
  return (-1);
}